

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O2

void anon_unknown.dwarf_4654::Test_TemplateTestUtilTest_GetSectionValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  char *__s2;
  TemplateDictionaryPeer peer;
  TemplateString local_d8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"test_GetSectionValue");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"VALUE");
  ctemplate::TemplateString::TemplateString(&local_d8,"value");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar2.length_ = local_d8.length_;
  TVar2.ptr_ = local_d8.ptr_;
  TVar2.is_immutable_ = local_d8.is_immutable_;
  TVar2._17_7_ = local_d8._17_7_;
  TVar2.id_ = local_d8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_98,"VALUE");
  __s2 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_98);
  iVar3 = strcmp("value",__s2);
  if (iVar3 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","strcmp(\"value\", peer.GetSectionValue(\"VALUE\")) == 0");
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, GetSectionValue) {
  TemplateDictionary dict("test_GetSectionValue");
  dict.SetValue("VALUE", "value");

  TemplateDictionaryPeer peer(&dict);
  EXPECT_STREQ("value", peer.GetSectionValue("VALUE"));
}